

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall soplex::CLUFactor<double>::packRows(CLUFactor<double> *this)

{
  U *pUVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  pointer pdVar6;
  int *piVar7;
  int *piVar8;
  Dring *pDVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  
  pUVar1 = &this->u;
  pDVar9 = (this->u).row.list.next;
  piVar4 = (this->u).row.max;
  if ((U *)pDVar9 == pUVar1) {
    uVar11 = 0;
  }
  else {
    piVar5 = (this->u).row.idx;
    pdVar6 = (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->u).row.len;
    piVar8 = (this->u).row.start;
    uVar12 = 0;
    do {
      iVar2 = pDVar9->idx;
      if (piVar8[iVar2] != (int)uVar12) goto LAB_00201553;
      uVar11 = (int)uVar12 + piVar7[iVar2];
      uVar12 = (ulong)uVar11;
      piVar4[iVar2] = piVar7[iVar2];
      pDVar9 = pDVar9->next;
    } while ((U *)pDVar9 != pUVar1);
  }
LAB_002015a2:
  piVar4[this->thedim] = 0;
  (this->u).row.used = uVar11;
  return;
LAB_00201553:
  do {
    iVar2 = pDVar9->idx;
    iVar3 = piVar8[iVar2];
    lVar10 = (long)iVar3;
    piVar8[iVar2] = (int)uVar12;
    piVar4[iVar2] = piVar7[iVar2];
    iVar2 = piVar7[iVar2];
    if (0 < iVar2) {
      uVar12 = (ulong)(int)uVar12;
      do {
        piVar5[uVar12] = piVar5[lVar10];
        pdVar6[uVar12] = pdVar6[lVar10];
        lVar10 = lVar10 + 1;
        uVar12 = uVar12 + 1;
      } while (lVar10 < iVar2 + iVar3);
    }
    uVar11 = (uint)uVar12;
    pDVar9 = pDVar9->next;
  } while ((U *)pDVar9 != pUVar1);
  goto LAB_002015a2;
}

Assistant:

void CLUFactor<R>::packRows()
{
   int n, i, j, l_row;
   Dring* ring, *list;

   int* l_ridx = u.row.idx;
   R* l_rval = u.row.val.data();
   int* l_rlen = u.row.len;
   int* l_rmax = u.row.max;
   int* l_rbeg = u.row.start;

   n = 0;
   list = &(u.row.list);

   for(ring = list->next; ring != list; ring = ring->next)
   {
      l_row = ring->idx;

      if(l_rbeg[l_row] != n)
      {
         do
         {
            l_row = ring->idx;
            i = l_rbeg[l_row];
            assert(l_rlen[l_row] <= l_rmax[l_row]);
            l_rbeg[l_row] = n;
            l_rmax[l_row] = l_rlen[l_row];
            j = i + l_rlen[l_row];

            for(; i < j; ++i, ++n)
            {
               assert(n <= i);
               l_ridx[n] = l_ridx[i];
               l_rval[n] = l_rval[i];
            }

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackRows;
      }

      n += l_rlen[l_row];

      l_rmax[l_row] = l_rlen[l_row];
   }

terminatePackRows:

   u.row.max[thedim] = 0;
   u.row.used = n;
}